

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmsnorm_x86_fma.cpp
# Opt level: O2

void ncnn::rmsnorm(float *ptr,float *gamma_ptr,float eps,int elemcount,int elempack)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  bool bVar14;
  bool bVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  float fVar27;
  float fVar33;
  float fVar34;
  __m128 _rms0;
  float fVar35;
  undefined1 auVar28 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar29 [28];
  undefined1 auVar32 [64];
  __m128 _rms1;
  undefined1 auVar22 [32];
  
  auVar23._4_60_ = in_register_00001204;
  auVar23._0_4_ = eps;
  iVar16 = elempack * elemcount;
  auVar32 = ZEXT1664(ZEXT816(0) << 0x40);
  lVar18 = 0;
  while( true ) {
    auVar29 = auVar32._0_28_;
    fVar27 = auVar32._0_4_;
    fVar33 = auVar32._4_4_;
    fVar34 = auVar32._8_4_;
    fVar35 = auVar32._12_4_;
    fVar3 = auVar32._16_4_;
    fVar4 = auVar32._20_4_;
    fVar9 = auVar32._24_4_;
    fVar10 = auVar32._28_4_;
    if (iVar16 <= (int)lVar18 + 7) break;
    pfVar1 = ptr + lVar18;
    auVar32 = ZEXT3264(CONCAT428(pfVar1[7] + fVar10,
                                 CONCAT424(pfVar1[6] * pfVar1[6] + fVar9,
                                           CONCAT420(pfVar1[5] * pfVar1[5] + fVar4,
                                                     CONCAT416(pfVar1[4] * pfVar1[4] + fVar3,
                                                               CONCAT412(pfVar1[3] * pfVar1[3] +
                                                                         fVar35,CONCAT48(pfVar1[2] *
                                                                                         pfVar1[2] +
                                                                                         fVar34,
                                                  CONCAT44(pfVar1[1] * pfVar1[1] + fVar33,
                                                           *pfVar1 * *pfVar1 + fVar27))))))));
    lVar18 = lVar18 + 8;
  }
  auVar20 = ZEXT816(0) << 0x40;
  while( true ) {
    fVar5 = auVar20._0_4_;
    fVar6 = auVar20._4_4_;
    fVar7 = auVar20._8_4_;
    fVar8 = auVar20._12_4_;
    if (iVar16 <= (int)lVar18 + 3) break;
    pfVar1 = ptr + lVar18;
    auVar20._0_4_ = *pfVar1 * *pfVar1 + fVar5;
    auVar20._4_4_ = pfVar1[1] * pfVar1[1] + fVar6;
    auVar20._8_4_ = pfVar1[2] * pfVar1[2] + fVar7;
    auVar20._12_4_ = pfVar1[3] * pfVar1[3] + fVar8;
    lVar18 = lVar18 + 4;
  }
  auVar25 = ZEXT1664(ZEXT816(0) << 0x40);
  for (; auVar24._0_4_ = auVar25._0_4_, (int)lVar18 < iVar16; lVar18 = lVar18 + 1) {
    auVar25 = ZEXT464((uint)(ptr[lVar18] * ptr[lVar18] + auVar24._0_4_));
  }
  auVar28 = auVar23._0_16_;
  if (elempack == 8) {
    auVar28 = vshufps_avx(auVar28,auVar28,0);
    auVar19 = vshufps_avx(ZEXT416((uint)(1.0 / (float)elemcount)),
                          ZEXT416((uint)(1.0 / (float)elemcount)),0);
    auVar22._0_4_ = fVar27 * auVar19._0_4_ + auVar28._0_4_;
    auVar22._4_4_ = fVar33 * auVar19._4_4_ + auVar28._4_4_;
    auVar22._8_4_ = fVar34 * auVar19._8_4_ + auVar28._8_4_;
    auVar22._12_4_ = fVar35 * auVar19._12_4_ + auVar28._12_4_;
    auVar22._16_4_ = fVar3 * auVar19._0_4_ + auVar28._0_4_;
    auVar22._20_4_ = fVar4 * auVar19._4_4_ + auVar28._4_4_;
    auVar22._24_4_ = fVar9 * auVar19._8_4_ + auVar28._8_4_;
    auVar22._28_4_ = fVar10 + auVar28._12_4_;
    auVar23 = ZEXT3264(auVar22);
    auVar31 = vrsqrtps_avx(auVar22);
    auVar29 = auVar31._0_28_;
    if (gamma_ptr == (float *)0x0) goto LAB_00532bcc;
    bVar15 = false;
    bVar14 = false;
  }
  else {
    if (elempack == 1) {
      auVar28 = vhaddps_avx(auVar32._16_16_,auVar32._0_16_);
      auVar19 = vshufpd_avx(auVar20,auVar20,1);
      auVar20 = vhaddps_avx(auVar28,auVar28);
      auVar26._0_4_ = auVar19._0_4_ + fVar5;
      auVar26._4_4_ = auVar19._4_4_ + fVar6;
      auVar26._8_4_ = auVar19._8_4_ + fVar7;
      auVar26._12_4_ = auVar19._12_4_ + fVar8;
      auVar20 = vhaddps_avx(auVar20,auVar20);
      auVar28 = vmovshdup_avx(auVar26);
      auVar20 = ZEXT416((uint)((auVar20._0_4_ + auVar28._0_4_ + auVar26._0_4_ + auVar24._0_4_) /
                               (float)elemcount + eps));
      auVar20 = vsqrtss_avx(auVar20,auVar20);
      auVar23 = ZEXT1664(auVar20);
      auVar24._0_4_ = 1.0 / auVar20._0_4_;
      auVar24._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar20 = vshufps_avx(auVar24,auVar24,0);
      auVar31._16_16_ = auVar20;
      auVar31._0_16_ = auVar20;
      auVar29 = auVar31._0_28_;
      bVar15 = true;
LAB_00532ad5:
      bVar14 = false;
    }
    else {
      if (elempack != 4) {
        bVar15 = false;
        goto LAB_00532ad5;
      }
      auVar20 = vshufps_avx(auVar28,auVar28,0);
      auVar28._0_4_ = 1.0 / (float)elemcount;
      auVar28._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar28 = vshufps_avx(auVar28,auVar28,0);
      auVar19._0_4_ = (fVar3 + fVar27 + fVar5) * auVar28._0_4_ + auVar20._0_4_;
      auVar19._4_4_ = (fVar4 + fVar33 + fVar6) * auVar28._4_4_ + auVar20._4_4_;
      auVar19._8_4_ = (fVar9 + fVar34 + fVar7) * auVar28._8_4_ + auVar20._8_4_;
      auVar19._12_4_ = (fVar10 + fVar35 + fVar8) * auVar28._12_4_ + auVar20._12_4_;
      auVar23 = ZEXT1664(auVar19);
      auVar20 = vrsqrtps_avx(auVar19);
      auVar30._16_16_ = auVar20;
      auVar30._0_16_ = auVar20;
      auVar29 = auVar30._0_28_;
      bVar14 = true;
      bVar15 = false;
    }
    if (gamma_ptr == (float *)0x0) {
LAB_00532bcc:
      for (lVar18 = 0; (int)lVar18 + 7 < iVar16; lVar18 = lVar18 + 8) {
        pfVar1 = ptr + lVar18;
        auVar32._0_4_ = auVar29._0_4_ * *pfVar1;
        auVar32._4_4_ = auVar29._4_4_ * pfVar1[1];
        auVar32._8_4_ = auVar29._8_4_ * pfVar1[2];
        auVar32._12_4_ = auVar29._12_4_ * pfVar1[3];
        auVar32._16_4_ = auVar29._16_4_ * pfVar1[4];
        auVar32._20_4_ = auVar29._20_4_ * pfVar1[5];
        auVar32._28_36_ = auVar23._28_36_;
        auVar32._24_4_ = auVar29._24_4_ * pfVar1[6];
        auVar23 = ZEXT3264(auVar32._0_32_);
        *(undefined1 (*) [32])(ptr + lVar18) = auVar32._0_32_;
      }
      for (; (int)lVar18 + 3 < iVar16; lVar18 = lVar18 + 4) {
        pfVar1 = ptr + lVar18;
        fVar3 = pfVar1[1];
        fVar4 = pfVar1[2];
        fVar9 = pfVar1[3];
        pfVar2 = ptr + lVar18;
        *pfVar2 = auVar20._0_4_ * *pfVar1;
        pfVar2[1] = auVar20._4_4_ * fVar3;
        pfVar2[2] = auVar20._8_4_ * fVar4;
        pfVar2[3] = auVar20._12_4_ * fVar9;
      }
      for (; (int)lVar18 < iVar16; lVar18 = lVar18 + 1) {
        ptr[lVar18] = auVar24._0_4_ * ptr[lVar18];
      }
      return;
    }
    iVar17 = 0;
    if (elempack != 8) goto LAB_00532b0f;
  }
  for (iVar17 = 0; iVar17 + 7 < iVar16; iVar17 = iVar17 + 8) {
    fVar3 = *gamma_ptr;
    auVar11._4_4_ = auVar29._4_4_ * *(float *)(*(undefined1 (*) [32])ptr + 4) * fVar3;
    auVar11._0_4_ = auVar29._0_4_ * *(float *)*(undefined1 (*) [32])ptr * fVar3;
    auVar11._8_4_ = auVar29._8_4_ * *(float *)(*(undefined1 (*) [32])ptr + 8) * fVar3;
    auVar11._12_4_ = auVar29._12_4_ * *(float *)(*(undefined1 (*) [32])ptr + 0xc) * fVar3;
    auVar11._16_4_ = auVar29._16_4_ * *(float *)(*(undefined1 (*) [32])ptr + 0x10) * fVar3;
    auVar11._20_4_ = auVar29._20_4_ * *(float *)(*(undefined1 (*) [32])ptr + 0x14) * fVar3;
    auVar11._24_4_ = auVar29._24_4_ * *(float *)(*(undefined1 (*) [32])ptr + 0x18) * fVar3;
    auVar11._28_4_ = fVar3;
    auVar23 = ZEXT3264(auVar11);
    *(undefined1 (*) [32])ptr = auVar11;
    ptr = (float *)((long)ptr + 0x20);
    gamma_ptr = gamma_ptr + 1;
  }
LAB_00532b0f:
  if (bVar14) {
    for (; iVar17 + 7 < iVar16; iVar17 = iVar17 + 8) {
      fVar3 = *gamma_ptr;
      fVar4 = gamma_ptr[1];
      auVar12._4_4_ = auVar29._4_4_ * *(float *)(*(undefined1 (*) [32])ptr + 4) * fVar3;
      auVar12._0_4_ = auVar29._0_4_ * *(float *)*(undefined1 (*) [32])ptr * fVar3;
      auVar12._8_4_ = auVar29._8_4_ * *(float *)(*(undefined1 (*) [32])ptr + 8) * fVar3;
      auVar12._12_4_ = auVar29._12_4_ * *(float *)(*(undefined1 (*) [32])ptr + 0xc) * fVar3;
      auVar12._16_4_ = auVar29._16_4_ * *(float *)(*(undefined1 (*) [32])ptr + 0x10) * fVar4;
      auVar12._20_4_ = auVar29._20_4_ * *(float *)(*(undefined1 (*) [32])ptr + 0x14) * fVar4;
      auVar12._24_4_ = auVar29._24_4_ * *(float *)(*(undefined1 (*) [32])ptr + 0x18) * fVar4;
      auVar12._28_4_ = fVar4;
      auVar23 = ZEXT3264(auVar12);
      *(undefined1 (*) [32])ptr = auVar12;
      ptr = (float *)((long)ptr + 0x20);
      gamma_ptr = gamma_ptr + 2;
    }
    for (; iVar17 + 3 < iVar16; iVar17 = iVar17 + 4) {
      fVar3 = *gamma_ptr;
      auVar21._0_4_ = auVar20._0_4_ * *(float *)*(undefined1 (*) [32])ptr * fVar3;
      auVar21._4_4_ = auVar20._4_4_ * *(float *)(*(undefined1 (*) [32])ptr + 4) * fVar3;
      auVar21._8_4_ = auVar20._8_4_ * *(float *)(*(undefined1 (*) [32])ptr + 8) * fVar3;
      auVar21._12_4_ = auVar20._12_4_ * *(float *)(*(undefined1 (*) [32])ptr + 0xc) * fVar3;
      auVar23 = ZEXT1664(auVar21);
      *(undefined1 (*) [16])*(undefined1 (*) [32])ptr = auVar21;
      ptr = (float *)(*(undefined1 (*) [32])ptr + 0x10);
      gamma_ptr = gamma_ptr + 1;
    }
  }
  if (bVar15) {
    for (; iVar17 + 7 < iVar16; iVar17 = iVar17 + 8) {
      auVar13._4_4_ = auVar29._4_4_ * *(float *)(*(undefined1 (*) [32])ptr + 4) * gamma_ptr[1];
      auVar13._0_4_ = auVar29._0_4_ * *(float *)*(undefined1 (*) [32])ptr * *gamma_ptr;
      auVar13._8_4_ = auVar29._8_4_ * *(float *)(*(undefined1 (*) [32])ptr + 8) * gamma_ptr[2];
      auVar13._12_4_ = auVar29._12_4_ * *(float *)(*(undefined1 (*) [32])ptr + 0xc) * gamma_ptr[3];
      auVar13._16_4_ = auVar29._16_4_ * *(float *)(*(undefined1 (*) [32])ptr + 0x10) * gamma_ptr[4];
      auVar13._20_4_ = auVar29._20_4_ * *(float *)(*(undefined1 (*) [32])ptr + 0x14) * gamma_ptr[5];
      auVar13._24_4_ = auVar29._24_4_ * *(float *)(*(undefined1 (*) [32])ptr + 0x18) * gamma_ptr[6];
      auVar13._28_4_ = auVar23._28_4_;
      auVar23 = ZEXT3264(auVar13);
      *(undefined1 (*) [32])ptr = auVar13;
      ptr = (float *)((long)ptr + 0x20);
      gamma_ptr = gamma_ptr + 8;
    }
    for (; iVar17 + 3 < iVar16; iVar17 = iVar17 + 4) {
      fVar3 = *(float *)(*(undefined1 (*) [32])ptr + 4);
      fVar4 = *(float *)(*(undefined1 (*) [32])ptr + 8);
      fVar9 = *(float *)(*(undefined1 (*) [32])ptr + 0xc);
      fVar10 = gamma_ptr[1];
      fVar27 = gamma_ptr[2];
      fVar33 = gamma_ptr[3];
      *(float *)*(undefined1 (*) [32])ptr =
           auVar20._0_4_ * *(float *)*(undefined1 (*) [32])ptr * *gamma_ptr;
      *(float *)(*(undefined1 (*) [32])ptr + 4) = auVar20._4_4_ * fVar3 * fVar10;
      *(float *)(*(undefined1 (*) [32])ptr + 8) = auVar20._8_4_ * fVar4 * fVar27;
      *(float *)(*(undefined1 (*) [32])ptr + 0xc) = auVar20._12_4_ * fVar9 * fVar33;
      ptr = (float *)(*(undefined1 (*) [32])ptr + 0x10);
      gamma_ptr = gamma_ptr + 4;
    }
  }
  for (lVar18 = 0; iVar17 + (int)lVar18 < iVar16; lVar18 = lVar18 + 1) {
    *(float *)(*(undefined1 (*) [32])ptr + lVar18 * 4) =
         auVar24._0_4_ * *(float *)(*(undefined1 (*) [32])ptr + lVar18 * 4) * gamma_ptr[lVar18];
  }
  return;
}

Assistant:

static void rmsnorm(float* ptr, const float* gamma_ptr, float eps, int elemcount, int elempack)
{
    const int size = elemcount * elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _rms_avx512 = _mm512_set1_ps(0.f);
#endif // __AVX512F__
    __m256 _rms_avx = _mm256_set1_ps(0.f);
#endif // __AVX__
    __m128 _rms = _mm_set1_ps(0.f);
#endif // __SSE2__
    float rms = 0.f;
    {
        const float* ptr0 = ptr;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr0);
            _rms_avx512 = _mm512_fmadd_ps(_p, _p, _rms_avx512);
            ptr0 += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr0);
            _rms_avx = _mm256_comp_fmadd_ps(_p, _p, _rms_avx);
            ptr0 += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr0);
            _rms = _mm_comp_fmadd_ps(_p, _p, _rms);
            ptr0 += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            rms += ptr0[0] * ptr0[0];
            ptr0++;
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        __m512 _elemcount = _mm512_set1_ps((float)elemcount);
        __m512 _eps = _mm512_set1_ps(eps);

        _rms_avx512 = _mm512_div_ps(_rms_avx512, _elemcount);
        _rms_avx512 = _mm512_add_ps(_rms_avx512, _eps);

        __m256 _rms0 = _mm256_rsqrt_ps(_mm512_extractf32x8_ps(_rms_avx512, 0));
        __m256 _rms1 = _mm256_rsqrt_ps(_mm512_extractf32x8_ps(_rms_avx512, 1));
        _rms_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_rms0), _rms1, 1);
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
#if __AVX512F__
        {
            __m256 _rms0 = _mm512_castps512_ps256(_rms_avx512);
            __m256 _rms1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_rms_avx512), 1));
            _rms_avx = _mm256_add_ps(_rms_avx, _rms0);
            _rms_avx = _mm256_add_ps(_rms_avx, _rms1);
        }
#endif // __AVX512F__

        __m256 _elemcount = _mm256_set1_ps((float)elemcount);
        __m256 _eps = _mm256_set1_ps(eps);

        _rms_avx = _mm256_div_ps(_rms_avx, _elemcount);
        _rms_avx = _mm256_add_ps(_rms_avx, _eps);

        _rms_avx = _mm256_rsqrt_ps(_rms_avx);
#if __AVX512F__
        _rms_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_rms_avx), _rms_avx, 1);
#endif // __AVX512F__
    }
#endif // __AVX__
    if (elempack == 4)
    {
#if __AVX__
#if __AVX512F__
        {
            __m256 _rms0 = _mm512_castps512_ps256(_rms_avx512);
            __m256 _rms1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_rms_avx512), 1));
            _rms_avx = _mm256_add_ps(_rms_avx, _rms0);
            _rms_avx = _mm256_add_ps(_rms_avx, _rms1);
        }
#endif // __AVX512F__
        {
            __m128 _rms0 = _mm256_castps256_ps128(_rms_avx);
            __m128 _rms1 = _mm256_extractf128_ps(_rms_avx, 1);
            _rms = _mm_add_ps(_rms, _rms0);
            _rms = _mm_add_ps(_rms, _rms1);
        }
#endif // __AVX__

        __m128 _elemcount = _mm_set1_ps((float)elemcount);
        __m128 _eps = _mm_set1_ps(eps);

        _rms = _mm_div_ps(_rms, _elemcount);
        _rms = _mm_add_ps(_rms, _eps);

        _rms = _mm_rsqrt_ps(_rms);
#if __AVX__
        _rms_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_rms), _rms, 1);
#if __AVX512F__
        _rms_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_rms_avx), _rms_avx, 1);
#endif // __AVX512F__
#endif // __AVX__
    }
#endif // __SSE2__
    if (elempack == 1)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        rms += _mm512_comp_reduce_add_ps(_rms_avx512);
#endif // __AVX512F__
        rms += _mm256_reduce_add_ps(_rms_avx);
#endif // __AVX__
        rms += _mm_reduce_add_ps(_rms);
#endif // __SSE2__

        rms = 1.f / sqrtf(rms / elemcount + eps);
#if __SSE2__
        _rms = _mm_set1_ps(rms);
#if __AVX__
        _rms_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_rms), _rms, 1);
#if __AVX512F__
        _rms_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_rms_avx), _rms_avx, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__
    }

    if (gamma_ptr)
    {
        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _gamma = _mm512_set1_ps(gamma_ptr[0]);
                _p = _mm512_mul_ps(_p, _rms_avx512);
                _p = _mm512_mul_ps(_p, _gamma);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 1;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m256 _gamma0 = _mm256_set1_ps(gamma_ptr[0]);
                __m256 _gamma1 = _mm256_set1_ps(gamma_ptr[1]);
                __m512 _gamma = _mm512_insertf32x8(_mm512_castps256_ps512(_gamma0), _gamma1, 1);
                _p = _mm512_mul_ps(_p, _rms_avx512);
                _p = _mm512_mul_ps(_p, _gamma);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 2;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _gamma = _mm256_set1_ps(gamma_ptr[0]);
                _p = _mm256_mul_ps(_p, _rms_avx);
                _p = _mm256_mul_ps(_p, _gamma);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
                gamma_ptr += 1;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m128 _gamma0 = _mm_set1_ps(gamma_ptr[0]);
                __m128 _gamma1 = _mm_set1_ps(gamma_ptr[1]);
                __m128 _gamma2 = _mm_set1_ps(gamma_ptr[2]);
                __m128 _gamma3 = _mm_set1_ps(gamma_ptr[3]);
                __m256 _gamma01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_gamma0), _gamma1, 1);
                __m256 _gamma23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_gamma2), _gamma3, 1);
                __m512 _gamma = _mm512_insertf32x8(_mm512_castps256_ps512(_gamma01), _gamma23, 1);
                _p = _mm512_mul_ps(_p, _rms_avx512);
                _p = _mm512_mul_ps(_p, _gamma);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 4;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m128 _gamma0 = _mm_set1_ps(gamma_ptr[0]);
                __m128 _gamma1 = _mm_set1_ps(gamma_ptr[1]);
                __m256 _gamma = _mm256_insertf128_ps(_mm256_castps128_ps256(_gamma0), _gamma1, 1);
                _p = _mm256_mul_ps(_p, _rms_avx);
                _p = _mm256_mul_ps(_p, _gamma);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
                gamma_ptr += 2;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _gamma = _mm_set1_ps(gamma_ptr[0]);
                _p = _mm_mul_ps(_p, _rms);
                _p = _mm_mul_ps(_p, _gamma);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
                gamma_ptr += 1;
            }
        }
        if (elempack == 1)
        {
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _gamma = _mm512_loadu_ps(gamma_ptr);
                _p = _mm512_mul_ps(_p, _rms_avx512);
                _p = _mm512_mul_ps(_p, _gamma);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _gamma = _mm256_loadu_ps(gamma_ptr);
                _p = _mm256_mul_ps(_p, _rms_avx);
                _p = _mm256_mul_ps(_p, _gamma);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
                gamma_ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _gamma = _mm_loadu_ps(gamma_ptr);
                _p = _mm_mul_ps(_p, _rms);
                _p = _mm_mul_ps(_p, _gamma);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
                gamma_ptr += 4;
            }
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            ptr[0] = (ptr[0] * rms) * gamma_ptr[0];
            ptr++;
            gamma_ptr++;
        }
    }
    else
    {
        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_mul_ps(_p, _rms_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_mul_ps(_p, _rms_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = _mm_mul_ps(_p, _rms);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            ptr[0] = ptr[0] * rms;
            ptr++;
        }
    }
}